

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

void __thiscall Imf_3_4::Context::addHeader(Context *this,int partnum,Header *h)

{
  element_type p_Var1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  element_type *pp_Var6;
  ArgExc *pAVar7;
  LineOrder *pLVar8;
  TileDescription *pTVar9;
  undefined8 uVar10;
  int *piVar11;
  float *pfVar12;
  double *pdVar13;
  Compression *pCVar14;
  Envmap *pEVar15;
  Vec2<int> *pVVar16;
  Vec2<float> *pVVar17;
  Vec2<double> *pVVar18;
  Vec3<int> *pVVar19;
  Vec3<float> *pVVar20;
  Vec3<double> *pVVar21;
  Matrix33<float> *pMVar22;
  Matrix33<double> *pMVar23;
  Matrix44<float> *pMVar24;
  Matrix44<double> *pMVar25;
  Box<Imath_3_2::Vec2<int>_> *pBVar26;
  Box<Imath_3_2::Vec2<float>_> *pBVar27;
  undefined4 in_ESI;
  exr_attr_chromaticities_t cac;
  Chromaticities ac;
  ChromaticitiesAttribute *attr_20;
  Box2fAttribute *attr_19;
  Box2iAttribute *attr_18;
  M44dAttribute *attr_17;
  M44fAttribute *attr_16;
  M33dAttribute *attr_15;
  M33fAttribute *attr_14;
  V3dAttribute *attr_13;
  V3fAttribute *attr_12;
  V3iAttribute *attr_11;
  V2dAttribute *attr_10;
  V2fAttribute *attr_9;
  V2iAttribute *attr_8;
  EnvmapAttribute *attr_7;
  CompressionAttribute *attr_6;
  DoubleAttribute *attr_5;
  FloatAttribute *attr_4;
  IntAttribute *attr_3;
  StringAttribute *attr_2;
  TileDescription td;
  TileDescriptionAttribute *attr_1;
  LineOrderAttribute *attr;
  Channel *cdef;
  ConstIterator c;
  ChannelList *chans;
  char *attrT;
  Attribute *a;
  ConstIterator i;
  exr_result_t rv;
  int in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  Chromaticities *in_stack_fffffffffffffa00;
  TypedAttribute<Imf_3_4::Chromaticities> *local_5d8;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *local_5a0;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *local_568;
  TypedAttribute<Imath_3_2::Matrix44<double>_> *local_530;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *local_4f8;
  TypedAttribute<Imath_3_2::Matrix33<double>_> *local_4c0;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *local_488;
  TypedAttribute<Imath_3_2::Vec3<double>_> *local_450;
  TypedAttribute<Imath_3_2::Vec3<float>_> *local_418;
  TypedAttribute<Imath_3_2::Vec3<int>_> *local_3e0;
  TypedAttribute<Imath_3_2::Vec2<double>_> *local_3a8;
  TypedAttribute<Imath_3_2::Vec2<float>_> *local_370;
  TypedAttribute<Imath_3_2::Vec2<int>_> *local_338;
  TypedAttribute<Imf_3_4::Envmap> *local_300;
  TypedAttribute<Imf_3_4::Compression> *local_2c8;
  TypedAttribute<double> *local_290;
  TypedAttribute<float> *local_258;
  TypedAttribute<int> *local_220;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e8;
  TypedAttribute<Imf_3_4::TileDescription> *local_1c8;
  TypedAttribute<Imf_3_4::LineOrder> *local_198;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  TypedAttribute<Imf_3_4::Chromaticities> *local_128;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *local_120;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *local_118;
  TypedAttribute<Imath_3_2::Matrix44<double>_> *local_110;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *local_108;
  TypedAttribute<Imath_3_2::Matrix33<double>_> *local_100;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *local_f8;
  TypedAttribute<Imath_3_2::Vec3<double>_> *local_f0;
  TypedAttribute<Imath_3_2::Vec3<float>_> *local_e8;
  TypedAttribute<Imath_3_2::Vec3<int>_> *local_e0;
  TypedAttribute<Imath_3_2::Vec2<double>_> *local_d8;
  TypedAttribute<Imath_3_2::Vec2<float>_> *local_d0;
  TypedAttribute<Imath_3_2::Vec2<int>_> *local_c8;
  TypedAttribute<Imf_3_4::Envmap> *local_c0;
  TypedAttribute<Imf_3_4::Compression> *local_b8;
  TypedAttribute<double> *local_b0;
  TypedAttribute<float> *local_a8;
  TypedAttribute<int> *local_a0;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  undefined8 local_90;
  undefined8 local_88;
  TypedAttribute<Imf_3_4::TileDescription> *local_80;
  TypedAttribute<Imf_3_4::LineOrder> *local_78;
  Channel *local_60;
  const_iterator local_58;
  const_iterator local_50;
  ChannelList *local_48;
  char *local_40;
  Attribute *local_38;
  const_iterator local_30;
  const_iterator local_28;
  int local_1c;
  undefined4 local_c;
  
  local_c = in_ESI;
  local_28._M_node =
       (_Base_ptr)
       Header::begin((Header *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  do {
    local_30._M_node =
         (_Base_ptr)
         Header::end((Header *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    bVar3 = Imf_3_4::operator!=((ConstIterator *)in_stack_fffffffffffffa00,
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    if (!bVar3) {
      return;
    }
    local_38 = Header::ConstIterator::attribute((ConstIterator *)0x195143);
    iVar4 = (*local_38->_vptr_Attribute[2])();
    local_40 = (char *)CONCAT44(extraout_var,iVar4);
    pcVar5 = Header::ConstIterator::name((ConstIterator *)0x19516e);
    iVar4 = strcmp(pcVar5,"channels");
    if (iVar4 == 0) {
      local_48 = Header::channels((Header *)0x195193);
      local_50._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      while( true ) {
        local_58._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        bVar3 = Imf_3_4::operator!=((ConstIterator *)in_stack_fffffffffffffa00,
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        if (!bVar3) break;
        local_60 = ChannelList::ConstIterator::channel((ConstIterator *)0x1951f0);
        pp_Var6 = std::
                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffffa00);
        uVar2 = local_c;
        p_Var1 = *pp_Var6;
        pcVar5 = ChannelList::ConstIterator::name((ConstIterator *)0x19522b);
        in_stack_fffffffffffff9f8 = local_60->ySampling;
        local_1c = exr_add_channel(p_Var1,uVar2,pcVar5,local_60->type,(local_60->pLinear & 1U) != 0,
                                   local_60->xSampling);
        if (local_1c != 0) {
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy channel information");
          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffa00);
      }
    }
    else {
      pcVar5 = Header::ConstIterator::name((ConstIterator *)0x195320);
      iVar4 = strcmp(pcVar5,"lineOrder");
      if (iVar4 == 0) {
        if (local_38 == (Attribute *)0x0) {
          local_198 = (TypedAttribute<Imf_3_4::LineOrder> *)0x0;
        }
        else {
          local_198 = (TypedAttribute<Imf_3_4::LineOrder> *)
                      __dynamic_cast(local_38,&Attribute::typeinfo,
                                     &TypedAttribute<Imf_3_4::LineOrder>::typeinfo,0);
        }
        local_78 = local_198;
        if (local_198 == (TypedAttribute<Imf_3_4::LineOrder> *)0x0) {
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        pp_Var6 = std::
                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffffa00);
        uVar2 = local_c;
        p_Var1 = *pp_Var6;
        pLVar8 = TypedAttribute<Imf_3_4::LineOrder>::value(local_78);
        local_1c = exr_set_lineorder(p_Var1,uVar2,*pLVar8);
        if (local_1c != 0) {
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        local_1c = 0;
      }
      else {
        iVar4 = strcmp(local_40,"tiledesc");
        if (iVar4 == 0) {
          if (local_38 == (Attribute *)0x0) {
            local_1c8 = (TypedAttribute<Imf_3_4::TileDescription> *)0x0;
          }
          else {
            local_1c8 = (TypedAttribute<Imf_3_4::TileDescription> *)
                        __dynamic_cast(local_38,&Attribute::typeinfo,
                                       &TypedAttribute<Imf_3_4::TileDescription>::typeinfo,0);
          }
          local_80 = local_1c8;
          if (local_1c8 == (TypedAttribute<Imf_3_4::TileDescription> *)0x0) {
            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
            __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
          }
          pTVar9 = TypedAttribute<Imf_3_4::TileDescription>::value(local_1c8);
          local_90._0_4_ = pTVar9->xSize;
          local_90._4_4_ = pTVar9->ySize;
          local_88._0_4_ = pTVar9->mode;
          local_88._4_4_ = pTVar9->roundingMode;
          pp_Var6 = std::
                    __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)in_stack_fffffffffffffa00);
          local_1c = exr_set_tile_descriptor
                               (*pp_Var6,local_c,local_90 & 0xffffffff,local_90._4_4_,
                                local_88 & 0xffffffff,local_88._4_4_);
          if (local_1c != 0) {
            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
            __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
          }
          local_1c = 0;
        }
        else {
          iVar4 = strcmp(local_40,"string");
          if (iVar4 == 0) {
            if (local_38 == (Attribute *)0x0) {
              local_1e8 = (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x0;
            }
            else {
              local_1e8 = (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)__dynamic_cast(local_38,&Attribute::typeinfo,
                                            &TypedAttribute<std::__cxx11::string>::typeinfo,0);
            }
            local_98 = local_1e8;
            if (local_1e8 ==
                (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
              __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            pp_Var6 = std::
                      __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)in_stack_fffffffffffffa00);
            uVar2 = local_c;
            p_Var1 = *pp_Var6;
            pcVar5 = Header::ConstIterator::name((ConstIterator *)0x1957ad);
            TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(local_98);
            uVar10 = std::__cxx11::string::c_str();
            local_1c = exr_attr_set_string(p_Var1,uVar2,pcVar5,uVar10);
            if (local_1c != 0) {
              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
              __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            local_1c = 0;
          }
          else {
            iVar4 = strcmp(local_40,"int");
            if (iVar4 == 0) {
              if (local_38 == (Attribute *)0x0) {
                local_220 = (TypedAttribute<int> *)0x0;
              }
              else {
                local_220 = (TypedAttribute<int> *)
                            __dynamic_cast(local_38,&Attribute::typeinfo,
                                           &TypedAttribute<int>::typeinfo,0);
              }
              local_a0 = local_220;
              if (local_220 == (TypedAttribute<int> *)0x0) {
                pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
              }
              pp_Var6 = std::
                        __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)in_stack_fffffffffffffa00);
              uVar2 = local_c;
              p_Var1 = *pp_Var6;
              pcVar5 = Header::ConstIterator::name((ConstIterator *)0x195983);
              piVar11 = TypedAttribute<int>::value(local_a0);
              local_1c = exr_attr_set_int(p_Var1,uVar2,pcVar5,*piVar11);
              if (local_1c != 0) {
                pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
              }
              local_1c = 0;
            }
            else {
              iVar4 = strcmp(local_40,"float");
              if (iVar4 == 0) {
                if (local_38 == (Attribute *)0x0) {
                  local_258 = (TypedAttribute<float> *)0x0;
                }
                else {
                  local_258 = (TypedAttribute<float> *)
                              __dynamic_cast(local_38,&Attribute::typeinfo,
                                             &TypedAttribute<float>::typeinfo,0);
                }
                local_a8 = local_258;
                if (local_258 == (TypedAttribute<float> *)0x0) {
                  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                  __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                }
                pp_Var6 = std::
                          __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)in_stack_fffffffffffffa00);
                uVar2 = local_c;
                p_Var1 = *pp_Var6;
                pcVar5 = Header::ConstIterator::name((ConstIterator *)0x195b50);
                pfVar12 = TypedAttribute<float>::value(local_a8);
                local_1c = exr_attr_set_float(*pfVar12,p_Var1,uVar2,pcVar5);
                if (local_1c != 0) {
                  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                  __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                }
                local_1c = 0;
              }
              else {
                iVar4 = strcmp(local_40,"double");
                if (iVar4 == 0) {
                  if (local_38 == (Attribute *)0x0) {
                    local_290 = (TypedAttribute<double> *)0x0;
                  }
                  else {
                    local_290 = (TypedAttribute<double> *)
                                __dynamic_cast(local_38,&Attribute::typeinfo,
                                               &TypedAttribute<double>::typeinfo,0);
                  }
                  local_b0 = local_290;
                  if (local_290 == (TypedAttribute<double> *)0x0) {
                    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                  }
                  pp_Var6 = std::
                            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)in_stack_fffffffffffffa00);
                  uVar2 = local_c;
                  p_Var1 = *pp_Var6;
                  pcVar5 = Header::ConstIterator::name((ConstIterator *)0x195d1f);
                  pdVar13 = TypedAttribute<double>::value(local_b0);
                  local_1c = exr_attr_set_double(*pdVar13,p_Var1,uVar2,pcVar5);
                  if (local_1c != 0) {
                    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                  }
                  local_1c = 0;
                }
                else {
                  iVar4 = strcmp(local_40,"compression");
                  if (iVar4 == 0) {
                    if (local_38 == (Attribute *)0x0) {
                      local_2c8 = (TypedAttribute<Imf_3_4::Compression> *)0x0;
                    }
                    else {
                      local_2c8 = (TypedAttribute<Imf_3_4::Compression> *)
                                  __dynamic_cast(local_38,&Attribute::typeinfo,
                                                 &TypedAttribute<Imf_3_4::Compression>::typeinfo,0);
                    }
                    local_b8 = local_2c8;
                    if (local_2c8 == (TypedAttribute<Imf_3_4::Compression> *)0x0) {
                      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                      Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                      __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                    }
                    pp_Var6 = std::
                              __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)in_stack_fffffffffffffa00);
                    uVar2 = local_c;
                    p_Var1 = *pp_Var6;
                    pcVar5 = Header::ConstIterator::name((ConstIterator *)0x195eee);
                    pCVar14 = TypedAttribute<Imf_3_4::Compression>::value(local_b8);
                    local_1c = exr_attr_set_compression(p_Var1,uVar2,pcVar5,*pCVar14);
                    if (local_1c != 0) {
                      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                      Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                      __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                    }
                    local_1c = 0;
                  }
                  else {
                    iVar4 = strcmp(local_40,"envmap");
                    if (iVar4 == 0) {
                      if (local_38 == (Attribute *)0x0) {
                        local_300 = (TypedAttribute<Imf_3_4::Envmap> *)0x0;
                      }
                      else {
                        local_300 = (TypedAttribute<Imf_3_4::Envmap> *)
                                    __dynamic_cast(local_38,&Attribute::typeinfo,
                                                   &TypedAttribute<Imf_3_4::Envmap>::typeinfo,0);
                      }
                      local_c0 = local_300;
                      if (local_300 == (TypedAttribute<Imf_3_4::Envmap> *)0x0) {
                        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                        Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                      }
                      pp_Var6 = std::
                                __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)in_stack_fffffffffffffa00);
                      uVar2 = local_c;
                      p_Var1 = *pp_Var6;
                      pcVar5 = Header::ConstIterator::name((ConstIterator *)0x1960bb);
                      pEVar15 = TypedAttribute<Imf_3_4::Envmap>::value(local_c0);
                      local_1c = exr_attr_set_envmap(p_Var1,uVar2,pcVar5,*pEVar15);
                      if (local_1c != 0) {
                        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                        Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                      }
                      local_1c = 0;
                    }
                    else {
                      iVar4 = strcmp(local_40,"v2i");
                      if (iVar4 == 0) {
                        if (local_38 == (Attribute *)0x0) {
                          local_338 = (TypedAttribute<Imath_3_2::Vec2<int>_> *)0x0;
                        }
                        else {
                          local_338 = (TypedAttribute<Imath_3_2::Vec2<int>_> *)
                                      __dynamic_cast(local_38,&Attribute::typeinfo,
                                                     &TypedAttribute<Imath_3_2::Vec2<int>>::typeinfo
                                                     ,0);
                        }
                        local_c8 = local_338;
                        if (local_338 == (TypedAttribute<Imath_3_2::Vec2<int>_> *)0x0) {
                          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                          Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                        }
                        pp_Var6 = std::
                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)in_stack_fffffffffffffa00);
                        uVar2 = local_c;
                        p_Var1 = *pp_Var6;
                        pcVar5 = Header::ConstIterator::name((ConstIterator *)0x196288);
                        pVVar16 = TypedAttribute<Imath_3_2::Vec2<int>_>::value(local_c8);
                        local_1c = exr_attr_set_v2i(p_Var1,uVar2,pcVar5,pVVar16);
                        if (local_1c != 0) {
                          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                          Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                        }
                        local_1c = 0;
                      }
                      else {
                        iVar4 = strcmp(local_40,"v2f");
                        if (iVar4 == 0) {
                          if (local_38 == (Attribute *)0x0) {
                            local_370 = (TypedAttribute<Imath_3_2::Vec2<float>_> *)0x0;
                          }
                          else {
                            local_370 = (TypedAttribute<Imath_3_2::Vec2<float>_> *)
                                        __dynamic_cast(local_38,&Attribute::typeinfo,
                                                       &TypedAttribute<Imath_3_2::Vec2<float>>::
                                                        typeinfo,0);
                          }
                          local_d0 = local_370;
                          if (local_370 == (TypedAttribute<Imath_3_2::Vec2<float>_> *)0x0) {
                            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                            Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                            __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                          }
                          pp_Var6 = std::
                                    __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)in_stack_fffffffffffffa00);
                          uVar2 = local_c;
                          p_Var1 = *pp_Var6;
                          pcVar5 = Header::ConstIterator::name((ConstIterator *)0x196456);
                          pVVar17 = TypedAttribute<Imath_3_2::Vec2<float>_>::value(local_d0);
                          local_1c = exr_attr_set_v2f(p_Var1,uVar2,pcVar5,pVVar17);
                          if (local_1c != 0) {
                            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                            Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                            __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                          }
                          local_1c = 0;
                        }
                        else {
                          iVar4 = strcmp(local_40,"v2d");
                          if (iVar4 == 0) {
                            if (local_38 == (Attribute *)0x0) {
                              local_3a8 = (TypedAttribute<Imath_3_2::Vec2<double>_> *)0x0;
                            }
                            else {
                              local_3a8 = (TypedAttribute<Imath_3_2::Vec2<double>_> *)
                                          __dynamic_cast(local_38,&Attribute::typeinfo,
                                                         &TypedAttribute<Imath_3_2::Vec2<double>>::
                                                          typeinfo,0);
                            }
                            local_d8 = local_3a8;
                            if (local_3a8 == (TypedAttribute<Imath_3_2::Vec2<double>_> *)0x0) {
                              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                              Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                              __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc
                                         );
                            }
                            pp_Var6 = std::
                                      __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                            uVar2 = local_c;
                            p_Var1 = *pp_Var6;
                            pcVar5 = Header::ConstIterator::name((ConstIterator *)0x196624);
                            pVVar18 = TypedAttribute<Imath_3_2::Vec2<double>_>::value(local_d8);
                            local_1c = exr_attr_set_v2d(p_Var1,uVar2,pcVar5,pVVar18);
                            if (local_1c != 0) {
                              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                              Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                              __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc
                                         );
                            }
                            local_1c = 0;
                          }
                          else {
                            iVar4 = strcmp(local_40,"v3i");
                            if (iVar4 == 0) {
                              if (local_38 == (Attribute *)0x0) {
                                local_3e0 = (TypedAttribute<Imath_3_2::Vec3<int>_> *)0x0;
                              }
                              else {
                                local_3e0 = (TypedAttribute<Imath_3_2::Vec3<int>_> *)
                                            __dynamic_cast(local_38,&Attribute::typeinfo,
                                                           &TypedAttribute<Imath_3_2::Vec3<int>>::
                                                            typeinfo,0);
                              }
                              local_e0 = local_3e0;
                              if (local_3e0 == (TypedAttribute<Imath_3_2::Vec3<int>_> *)0x0) {
                                pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                                __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                            Iex_3_4::ArgExc::~ArgExc);
                              }
                              pp_Var6 = std::
                                        __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                              uVar2 = local_c;
                              p_Var1 = *pp_Var6;
                              pcVar5 = Header::ConstIterator::name((ConstIterator *)0x1967f2);
                              pVVar19 = TypedAttribute<Imath_3_2::Vec3<int>_>::value(local_e0);
                              local_1c = exr_attr_set_v3i(p_Var1,uVar2,pcVar5,pVVar19);
                              if (local_1c != 0) {
                                pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                                __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                            Iex_3_4::ArgExc::~ArgExc);
                              }
                              local_1c = 0;
                            }
                            else {
                              iVar4 = strcmp(local_40,"v3f");
                              if (iVar4 == 0) {
                                if (local_38 == (Attribute *)0x0) {
                                  local_418 = (TypedAttribute<Imath_3_2::Vec3<float>_> *)0x0;
                                }
                                else {
                                  local_418 = (TypedAttribute<Imath_3_2::Vec3<float>_> *)
                                              __dynamic_cast(local_38,&Attribute::typeinfo,
                                                             &TypedAttribute<Imath_3_2::Vec3<float>>
                                                              ::typeinfo,0);
                                }
                                local_e8 = local_418;
                                if (local_418 == (TypedAttribute<Imath_3_2::Vec3<float>_> *)0x0) {
                                  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                  Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                                  __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                              Iex_3_4::ArgExc::~ArgExc);
                                }
                                pp_Var6 = std::
                                          __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                uVar2 = local_c;
                                p_Var1 = *pp_Var6;
                                pcVar5 = Header::ConstIterator::name((ConstIterator *)0x1969c0);
                                pVVar20 = TypedAttribute<Imath_3_2::Vec3<float>_>::value(local_e8);
                                local_1c = exr_attr_set_v3f(p_Var1,uVar2,pcVar5,pVVar20);
                                if (local_1c != 0) {
                                  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                  Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                                  __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                              Iex_3_4::ArgExc::~ArgExc);
                                }
                                local_1c = 0;
                              }
                              else {
                                iVar4 = strcmp(local_40,"v3d");
                                if (iVar4 == 0) {
                                  if (local_38 == (Attribute *)0x0) {
                                    local_450 = (TypedAttribute<Imath_3_2::Vec3<double>_> *)0x0;
                                  }
                                  else {
                                    local_450 = (TypedAttribute<Imath_3_2::Vec3<double>_> *)
                                                __dynamic_cast(local_38,&Attribute::typeinfo,
                                                               &
                                                  TypedAttribute<Imath_3_2::Vec3<double>>::typeinfo,
                                                  0);
                                  }
                                  local_f0 = local_450;
                                  if (local_450 == (TypedAttribute<Imath_3_2::Vec3<double>_> *)0x0)
                                  {
                                    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                    Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                                    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                Iex_3_4::ArgExc::~ArgExc);
                                  }
                                  pp_Var6 = std::
                                            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                  uVar2 = local_c;
                                  p_Var1 = *pp_Var6;
                                  pcVar5 = Header::ConstIterator::name((ConstIterator *)0x196b8e);
                                  pVVar21 = TypedAttribute<Imath_3_2::Vec3<double>_>::value
                                                      (local_f0);
                                  local_1c = exr_attr_set_v3d(p_Var1,uVar2,pcVar5,pVVar21);
                                  if (local_1c != 0) {
                                    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                    Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                                    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                Iex_3_4::ArgExc::~ArgExc);
                                  }
                                  local_1c = 0;
                                }
                                else {
                                  iVar4 = strcmp(local_40,"m33f");
                                  if (iVar4 == 0) {
                                    if (local_38 == (Attribute *)0x0) {
                                      local_488 = (TypedAttribute<Imath_3_2::Matrix33<float>_> *)0x0
                                      ;
                                    }
                                    else {
                                      local_488 = (TypedAttribute<Imath_3_2::Matrix33<float>_> *)
                                                  __dynamic_cast(local_38,&Attribute::typeinfo,
                                                                 &
                                                  TypedAttribute<Imath_3_2::Matrix33<float>>::
                                                  typeinfo,0);
                                    }
                                    local_f8 = local_488;
                                    if (local_488 ==
                                        (TypedAttribute<Imath_3_2::Matrix33<float>_> *)0x0) {
                                      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                      Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                                      __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                  Iex_3_4::ArgExc::~ArgExc);
                                    }
                                    pp_Var6 = std::
                                              __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                    uVar2 = local_c;
                                    p_Var1 = *pp_Var6;
                                    pcVar5 = Header::ConstIterator::name((ConstIterator *)0x196d5c);
                                    pMVar22 = TypedAttribute<Imath_3_2::Matrix33<float>_>::value
                                                        (local_f8);
                                    local_1c = exr_attr_set_m33f(p_Var1,uVar2,pcVar5,pMVar22);
                                    if (local_1c != 0) {
                                      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                      Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                                      __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                  Iex_3_4::ArgExc::~ArgExc);
                                    }
                                    local_1c = 0;
                                  }
                                  else {
                                    iVar4 = strcmp(local_40,"m33d");
                                    if (iVar4 == 0) {
                                      if (local_38 == (Attribute *)0x0) {
                                        local_4c0 = (TypedAttribute<Imath_3_2::Matrix33<double>_> *)
                                                    0x0;
                                      }
                                      else {
                                        local_4c0 = (TypedAttribute<Imath_3_2::Matrix33<double>_> *)
                                                    __dynamic_cast(local_38,&Attribute::typeinfo,
                                                                   &
                                                  TypedAttribute<Imath_3_2::Matrix33<double>>::
                                                  typeinfo,0);
                                      }
                                      local_100 = local_4c0;
                                      if (local_4c0 ==
                                          (TypedAttribute<Imath_3_2::Matrix33<double>_> *)0x0) {
                                        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                        Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch");
                                        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                    Iex_3_4::ArgExc::~ArgExc);
                                      }
                                      pp_Var6 = std::
                                                __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                      uVar2 = local_c;
                                      p_Var1 = *pp_Var6;
                                      pcVar5 = Header::ConstIterator::name
                                                         ((ConstIterator *)0x196f2a);
                                      pMVar23 = TypedAttribute<Imath_3_2::Matrix33<double>_>::value
                                                          (local_100);
                                      local_1c = exr_attr_set_m33d(p_Var1,uVar2,pcVar5,pMVar23);
                                      if (local_1c != 0) {
                                        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                        Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute");
                                        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                    Iex_3_4::ArgExc::~ArgExc);
                                      }
                                      local_1c = 0;
                                    }
                                    else {
                                      iVar4 = strcmp(local_40,"m44f");
                                      if (iVar4 == 0) {
                                        if (local_38 == (Attribute *)0x0) {
                                          local_4f8 = (TypedAttribute<Imath_3_2::Matrix44<float>_> *
                                                      )0x0;
                                        }
                                        else {
                                          local_4f8 = (TypedAttribute<Imath_3_2::Matrix44<float>_> *
                                                      )__dynamic_cast(local_38,&Attribute::typeinfo,
                                                                      &
                                                  TypedAttribute<Imath_3_2::Matrix44<float>>::
                                                  typeinfo,0);
                                        }
                                        local_108 = local_4f8;
                                        if (local_4f8 ==
                                            (TypedAttribute<Imath_3_2::Matrix44<float>_> *)0x0) {
                                          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                          Iex_3_4::ArgExc::ArgExc(pAVar7,"unexpected type mismatch")
                                          ;
                                          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                      Iex_3_4::ArgExc::~ArgExc);
                                        }
                                        pp_Var6 = std::
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                        uVar2 = local_c;
                                        p_Var1 = *pp_Var6;
                                        pcVar5 = Header::ConstIterator::name
                                                           ((ConstIterator *)0x1970f8);
                                        pMVar24 = TypedAttribute<Imath_3_2::Matrix44<float>_>::value
                                                            (local_108);
                                        local_1c = exr_attr_set_m44f(p_Var1,uVar2,pcVar5,pMVar24);
                                        if (local_1c != 0) {
                                          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                          Iex_3_4::ArgExc::ArgExc(pAVar7,"Unable to copy attribute")
                                          ;
                                          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                      Iex_3_4::ArgExc::~ArgExc);
                                        }
                                        local_1c = 0;
                                      }
                                      else {
                                        iVar4 = strcmp(local_40,"m44d");
                                        if (iVar4 == 0) {
                                          if (local_38 == (Attribute *)0x0) {
                                            local_530 = (
                                                  TypedAttribute<Imath_3_2::Matrix44<double>_> *)0x0
                                            ;
                                          }
                                          else {
                                            local_530 = (
                                                  TypedAttribute<Imath_3_2::Matrix44<double>_> *)
                                                  __dynamic_cast(local_38,&Attribute::typeinfo,
                                                                 &
                                                  TypedAttribute<Imath_3_2::Matrix44<double>>::
                                                  typeinfo,0);
                                          }
                                          local_110 = local_530;
                                          if (local_530 ==
                                              (TypedAttribute<Imath_3_2::Matrix44<double>_> *)0x0) {
                                            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                            Iex_3_4::ArgExc::ArgExc
                                                      (pAVar7,"unexpected type mismatch");
                                            __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                        Iex_3_4::ArgExc::~ArgExc);
                                          }
                                          pp_Var6 = std::
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                          uVar2 = local_c;
                                          p_Var1 = *pp_Var6;
                                          pcVar5 = Header::ConstIterator::name
                                                             ((ConstIterator *)0x1972c6);
                                          pMVar25 = TypedAttribute<Imath_3_2::Matrix44<double>_>::
                                                    value(local_110);
                                          local_1c = exr_attr_set_m44d(p_Var1,uVar2,pcVar5,pMVar25);
                                          if (local_1c != 0) {
                                            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                            Iex_3_4::ArgExc::ArgExc
                                                      (pAVar7,"Unable to copy attribute");
                                            __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                        Iex_3_4::ArgExc::~ArgExc);
                                          }
                                          local_1c = 0;
                                        }
                                        else {
                                          iVar4 = strcmp(local_40,"box2i");
                                          if (iVar4 == 0) {
                                            if (local_38 == (Attribute *)0x0) {
                                              local_568 = (
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>
                                                  *)0x0;
                                            }
                                            else {
                                              local_568 = (
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>
                                                  *)__dynamic_cast(local_38,&Attribute::typeinfo,
                                                                   &
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>
                                                  ::typeinfo,0);
                                            }
                                            local_118 = local_568;
                                            if (local_568 ==
                                                (TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>
                                                 *)0x0) {
                                              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                              Iex_3_4::ArgExc::ArgExc
                                                        (pAVar7,"unexpected type mismatch");
                                              __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                          Iex_3_4::ArgExc::~ArgExc);
                                            }
                                            pp_Var6 = std::
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                            uVar2 = local_c;
                                            p_Var1 = *pp_Var6;
                                            pcVar5 = Header::ConstIterator::name
                                                               ((ConstIterator *)0x197494);
                                            pBVar26 = 
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>
                                                  ::value(local_118);
                                            local_1c = exr_attr_set_box2i(p_Var1,uVar2,pcVar5,
                                                                          pBVar26);
                                            if (local_1c != 0) {
                                              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                              Iex_3_4::ArgExc::ArgExc
                                                        (pAVar7,"Unable to copy attribute");
                                              __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                          Iex_3_4::ArgExc::~ArgExc);
                                            }
                                            local_1c = 0;
                                          }
                                          else {
                                            iVar4 = strcmp(local_40,"box2f");
                                            if (iVar4 == 0) {
                                              if (local_38 == (Attribute *)0x0) {
                                                local_5a0 = (
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>
                                                  *)0x0;
                                              }
                                              else {
                                                local_5a0 = (
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>
                                                  *)__dynamic_cast(local_38,&Attribute::typeinfo,
                                                                   &
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>
                                                  ::typeinfo,0);
                                              }
                                              local_120 = local_5a0;
                                              if (local_5a0 ==
                                                  (
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>
                                                  *)0x0) {
                                                pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                                Iex_3_4::ArgExc::ArgExc
                                                          (pAVar7,"unexpected type mismatch");
                                                __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                            Iex_3_4::ArgExc::~ArgExc);
                                              }
                                              pp_Var6 = std::
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                              uVar2 = local_c;
                                              p_Var1 = *pp_Var6;
                                              pcVar5 = Header::ConstIterator::name
                                                                 ((ConstIterator *)0x19763b);
                                              pBVar27 = 
                                                  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>
                                                  ::value(local_120);
                                              local_1c = exr_attr_set_box2f(p_Var1,uVar2,pcVar5,
                                                                            pBVar27);
                                              if (local_1c != 0) {
                                                pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                                Iex_3_4::ArgExc::ArgExc
                                                          (pAVar7,"Unable to copy attribute");
                                                __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                            Iex_3_4::ArgExc::~ArgExc);
                                              }
                                              local_1c = 0;
                                            }
                                            else {
                                              iVar4 = strcmp(local_40,"chromaticities");
                                              if (iVar4 == 0) {
                                                if (local_38 == (Attribute *)0x0) {
                                                  local_5d8 = (
                                                  TypedAttribute<Imf_3_4::Chromaticities> *)0x0;
                                                }
                                                else {
                                                  local_5d8 = (
                                                  TypedAttribute<Imf_3_4::Chromaticities> *)
                                                  __dynamic_cast(local_38,&Attribute::typeinfo,
                                                                 &
                                                  TypedAttribute<Imf_3_4::Chromaticities>::typeinfo,
                                                  0);
                                                }
                                                local_128 = local_5d8;
                                                if (local_5d8 ==
                                                    (TypedAttribute<Imf_3_4::Chromaticities> *)0x0)
                                                {
                                                  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                                  Iex_3_4::ArgExc::ArgExc
                                                            (pAVar7,"unexpected type mismatch");
                                                  __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                              Iex_3_4::ArgExc::~ArgExc);
                                                }
                                                TypedAttribute<Imf_3_4::Chromaticities>::value
                                                          (local_5d8);
                                                Chromaticities::Chromaticities
                                                          (in_stack_fffffffffffffa00,
                                                           (Chromaticities *)
                                                           CONCAT44(in_stack_fffffffffffff9fc,
                                                                    in_stack_fffffffffffff9f8));
                                                local_168 = local_148;
                                                local_164 = local_144;
                                                local_160 = local_140;
                                                local_15c = local_13c;
                                                local_158 = local_138;
                                                local_154 = local_134;
                                                local_150 = local_130;
                                                local_14c = local_12c;
                                                pp_Var6 = std::
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                                uVar2 = local_c;
                                                p_Var1 = *pp_Var6;
                                                pcVar5 = Header::ConstIterator::name
                                                                   ((ConstIterator *)0x197883);
                                                local_1c = exr_attr_set_chromaticities
                                                                     (p_Var1,uVar2,pcVar5,&local_168
                                                                     );
                                                if (local_1c != 0) {
                                                  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                                                  Iex_3_4::ArgExc::ArgExc
                                                            (pAVar7,"Unable to copy attribute");
                                                  __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,
                                                              Iex_3_4::ArgExc::~ArgExc);
                                                }
                                                local_1c = 0;
                                              }
                                              else {
                                                iVar4 = strcmp(local_40,"stringvector");
                                                if ((((iVar4 != 0) &&
                                                     (iVar4 = strcmp(local_40,"floatvector"),
                                                     iVar4 != 0)) &&
                                                    (iVar4 = strcmp(local_40,"preview"), iVar4 != 0)
                                                    ) && (((iVar4 = strcmp(local_40,"rational"),
                                                           iVar4 != 0 &&
                                                           (iVar4 = strcmp(local_40,"timecode"),
                                                           iVar4 != 0)) &&
                                                          (iVar4 = strcmp(local_40,"keycode"),
                                                          iVar4 != 0)))) {
                                                  strcmp(local_40,"deepImageState");
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffa00);
  } while( true );
}

Assistant:

void Context::addHeader (int partnum, const Header &h)
{
    exr_result_t rv;
    // TODO: ImfHeader iterator types should support operator* so they can
    // use ranged-based for
    for (auto i = h.begin (); i != h.end (); ++i)
    {
        const Attribute& a = i.attribute ();
        const char* attrT = a.typeName ();

        if (!strcmp (i.name (), "channels"))
        {
            const ChannelList& chans = h.channels ();

            for (auto c = chans.begin (); c != chans.end (); ++c)
            {
                const Channel &cdef = c.channel ();
                rv = exr_add_channel (
                    *_ctxt, partnum, c.name (),
                    (exr_pixel_type_t)cdef.type,
                    cdef.pLinear ? EXR_PERCEPTUALLY_LINEAR : EXR_PERCEPTUALLY_LOGARITHMIC,
                    cdef.xSampling,
                    cdef.ySampling);
                if (rv != EXR_ERR_SUCCESS)
                    throw IEX_NAMESPACE::ArgExc ("Unable to copy channel information");
            }
            continue;
        }

        if (!strcmp (i.name (), "lineOrder"))
        {
            const LineOrderAttribute *attr =
                dynamic_cast<const LineOrderAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            rv = exr_set_lineorder (
                *_ctxt, partnum, (exr_lineorder_t)attr->value ());
            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        if (!strcmp (attrT, "tiledesc"))
        {
            const TileDescriptionAttribute *attr =
                dynamic_cast<const TileDescriptionAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            TileDescription td = attr->value ();

            rv = exr_set_tile_descriptor (
                *_ctxt, partnum,
                td.xSize,
                td.ySize,
                (exr_tile_level_mode_t)td.mode,
                (exr_tile_round_mode_t)td.roundingMode);

            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        EXR_SET_ATTR(string, StringAttribute, attr->value ().c_str ());
        EXR_SET_ATTR(int, IntAttribute, attr->value ());
        EXR_SET_ATTR(float, FloatAttribute, attr->value ());
        EXR_SET_ATTR(double, DoubleAttribute, attr->value ());
        EXR_SET_ATTR(compression, CompressionAttribute, (exr_compression_t)attr->value ());
        EXR_SET_ATTR(envmap, EnvmapAttribute, (exr_envmap_t)attr->value ());
        EXR_SET_ATTR(v2i, V2iAttribute,
                     reinterpret_cast<const exr_attr_v2i_t*>(&(attr->value ())));
        EXR_SET_ATTR(v2f, V2fAttribute,
                     reinterpret_cast<const exr_attr_v2f_t*>(&(attr->value ())));
        EXR_SET_ATTR(v2d, V2dAttribute,
                     reinterpret_cast<const exr_attr_v2d_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3i, V3iAttribute,
                     reinterpret_cast<const exr_attr_v3i_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3f, V3fAttribute,
                     reinterpret_cast<const exr_attr_v3f_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3d, V3dAttribute,
                     reinterpret_cast<const exr_attr_v3d_t*>(&(attr->value ())));
        EXR_SET_ATTR(m33f, M33fAttribute,
                     reinterpret_cast<const exr_attr_m33f_t*>(&(attr->value ())));
        EXR_SET_ATTR(m33d, M33dAttribute,
                     reinterpret_cast<const exr_attr_m33d_t*>(&(attr->value ())));
        EXR_SET_ATTR(m44f, M44fAttribute,
                     reinterpret_cast<const exr_attr_m44f_t*>(&(attr->value ())));
        EXR_SET_ATTR(m44d, M44dAttribute,
                     reinterpret_cast<const exr_attr_m44d_t*>(&(attr->value ())));
        EXR_SET_ATTR(box2i, Box2iAttribute,
                     reinterpret_cast<const exr_attr_box2i_t*>(&(attr->value ())));
        EXR_SET_ATTR(box2f, Box2fAttribute,
                     reinterpret_cast<const exr_attr_box2f_t*>(&(attr->value ())));

        if (!strcmp (attrT, "chromaticities"))
        {
            const ChromaticitiesAttribute *attr =
                dynamic_cast<const ChromaticitiesAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            Chromaticities ac = attr->value ();
            exr_attr_chromaticities_t cac;

            cac.red_x = ac.red.x;
            cac.red_y = ac.red.y;
            cac.green_x = ac.green.x;
            cac.green_y = ac.green.y;
            cac.blue_x = ac.blue.x;
            cac.blue_y = ac.blue.y;
            cac.white_x = ac.white.x;
            cac.white_y = ac.white.y;

            rv = exr_attr_set_chromaticities (
                *_ctxt, partnum, i.name (), &cac);

            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        if (!strcmp (attrT, "stringvector"))
        {
            continue;
        }

        if (!strcmp (attrT, "floatvector"))
        {
            continue;
        }

        if (!strcmp (attrT, "preview"))
        {
            continue;
        }

        if (!strcmp (attrT, "rational"))
        {
            continue;
        }

        if (!strcmp (attrT, "timecode"))
        {
            continue;
        }

        if (!strcmp (attrT, "keycode"))
        {
            continue;
        }

        if (!strcmp (attrT, "deepImageState"))
        {
            continue;
        }

        //THROW (
        //    IEX_NAMESPACE::LogicExc,
        //    "Conversion of attribute '" << i.name () << "' of type '" << attrT
        //    << "' to core value not yet implemented");
    }
}